

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O2

long cmsys::SystemTools::ModifiedTime(string *filename)

{
  int iVar1;
  stat fs;
  stat64 local_90;
  
  iVar1 = stat64((filename->_M_dataplus)._M_p,&local_90);
  if (iVar1 != 0) {
    local_90.st_mtim.tv_sec = 0;
  }
  return local_90.st_mtim.tv_sec;
}

Assistant:

long int SystemTools::ModifiedTime(const kwsys_stl::string& filename)
{
  long int mt = 0;
#ifdef _WIN32
  WIN32_FILE_ATTRIBUTE_DATA fs;
  if (GetFileAttributesExW(
        SystemTools::ConvertToWindowsExtendedPath(filename).c_str(),
                           GetFileExInfoStandard,
                           &fs) != 0)
    {
    mt = windows_filetime_to_posix_time(fs.ftLastWriteTime);
    }
#else
  struct stat fs;
  if (stat(filename.c_str(), &fs) == 0)
    {
    mt = static_cast<long int>(fs.st_mtime);
    }
#endif
  return mt;
}